

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::CmpHelperNeRange<int[5],int[5]>
          (AssertionResult *__return_storage_ptr__,iuutil *this,char *expected_expr,
          char *actual_expr,int (*expected) [5],int (*actual) [5])

{
  bool bVar1;
  iuutil *this_00;
  int *b1;
  int (*e1) [5];
  int *b2;
  AssertionResult *pAVar2;
  string local_b0;
  AssertionResult local_90;
  undefined4 local_68;
  undefined1 local_58 [8];
  AssertionResult ar;
  int (*actual_local) [5];
  int (*expected_local) [5];
  char *actual_expr_local;
  char *expected_expr_local;
  
  ar._32_8_ = expected;
  expected_local = (int (*) [5])expected_expr;
  actual_expr_local = (char *)this;
  expected_expr_local = (char *)__return_storage_ptr__;
  this_00 = (iuutil *)std::begin<int_const,5ul>((int (*) [5])actual_expr);
  b1 = std::end<int_const,5ul>((int (*) [5])actual_expr);
  e1 = (int (*) [5])std::begin<int_const,5ul>((int (*) [5])ar._32_8_);
  b2 = std::end<int_const,5ul>((int (*) [5])ar._32_8_);
  CmpHelperNeIterator<int_const*,int_const*>
            ((AssertionResult *)local_58,this_00,b1,(int *)e1,b2,*actual);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (bVar1) {
    iutest::AssertionSuccess();
  }
  else {
    iutest::AssertionFailure();
    pAVar2 = iutest::AssertionResult::operator<<(&local_90,(char (*) [18])"error: Expected: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&actual_expr_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [5])" != ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char **)&expected_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])" \n  Actual:");
    iutest::internal::FormatForComparisonFailureMessage<int[5],int[5]>
              (&local_b0,(internal *)actual_expr,(int (*) [5])ar._32_8_,e1);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_b0);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_b0);
    iutest::AssertionResult::~AssertionResult(&local_90);
  }
  local_68 = 1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeRange(const char* expected_expr, const char* actual_expr
    , const T1& expected, const T2& actual)
{
    IUTEST_USING_BEGIN_END();
    if( ::iutest::AssertionResult ar =
        CmpHelperNeIterator(begin(expected), end(expected), begin(actual), end(actual)))
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: " << expected_expr << " != " << actual_expr
            << " \n  Actual:" << ::iutest::internal::FormatForComparisonFailureMessage(expected, actual);
    }
}